

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  ushort uVar1;
  int iCur;
  int iVar2;
  uint op;
  int iVar3;
  int prefixOnly;
  Vdbe *pVVar4;
  Index *pIdx;
  int in_EDX;
  long in_RSI;
  Parse *in_RDI;
  int j2;
  int iDb;
  sqlite3 *db;
  int regRecord;
  KeyInfo *pKey;
  Vdbe *v;
  int iPartIdxLabel;
  int tnum;
  int addr2;
  int addr1;
  int iSorter;
  int iIdx;
  int iTab;
  Table *pTab;
  Parse *in_stack_ffffffffffffff78;
  undefined4 uVar7;
  char *pcVar5;
  undefined8 uVar6;
  int in_stack_ffffffffffffff80;
  int p3;
  int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  sqlite3 *db_00;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Parse *in_stack_ffffffffffffffb0;
  Vdbe *p;
  Parse *in_stack_ffffffffffffffc0;
  int iVar8;
  int iVar9;
  
  in_RDI->nTab = in_RDI->nTab + 1;
  iVar9 = in_RDI->nTab;
  in_RDI->nTab = iVar9 + 1;
  db_00 = in_RDI->db;
  iCur = sqlite3SchemaToIndex(db_00,*(Schema **)(in_RSI + 0x30));
  iVar2 = sqlite3AuthCheck((Parse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int)((ulong)db_00 >> 0x20),
                           (char *)CONCAT44(iCur,in_stack_ffffffffffffff98),
                           (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
  if (iVar2 == 0) {
    sqlite3TableLock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                     (u8)((ulong)db_00 >> 0x38),(char *)CONCAT44(iCur,in_stack_ffffffffffffff98));
    pVVar4 = sqlite3GetVdbe(in_stack_ffffffffffffff78);
    uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (pVVar4 != (Vdbe *)0x0) {
      pIdx = (Index *)sqlite3KeyInfoOfIndex
                                ((Parse *)CONCAT44(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8),(Index *)db_00);
      iVar2 = in_RDI->nTab;
      in_RDI->nTab = iVar2 + 1;
      op = (uint)*(ushort *)(in_RSI + 0x5e);
      p = pVVar4;
      iVar8 = iVar2;
      sqlite3KeyInfoRef((KeyInfo *)pIdx);
      pcVar5 = (char *)CONCAT44(uVar7,0xfffffff7);
      sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar2),(int)((ulong)pVVar4 >> 0x20),(int)pVVar4,
                        in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,pcVar5,(int)db_00);
      sqlite3OpenTable((Parse *)db_00,iCur,in_stack_ffffffffffffff98,(Table *)CONCAT44(op,iVar2),
                       (int)((ulong)pVVar4 >> 0x20));
      iVar3 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                ),(int)((ulong)pcVar5 >> 0x20),(int)pcVar5,0);
      prefixOnly = sqlite3GetTempReg(in_RDI);
      sqlite3MultiWrite(in_RDI);
      uVar6 = 0;
      p3 = 0;
      sqlite3GenerateIndexKey
                (in_stack_ffffffffffffffc0,(Index *)p,(int)((ulong)pIdx >> 0x20),(int)pIdx,
                 prefixOnly,(int *)db_00,(Index *)CONCAT44(iVar8,iVar3),iVar9);
      iVar9 = (int)db_00;
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)uVar6 >> 0x20),
                        (int)uVar6,0);
      sqlite3ResolvePartIdxLabel
                ((Parse *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)uVar6 >> 0x20));
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)uVar6 >> 0x20),
                        (int)uVar6,0);
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)uVar6 >> 0x20)
                         );
      if (in_EDX < 0) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)uVar6 >> 0x20)
                          ,(int)uVar6,0);
      }
      pcVar5 = (char *)CONCAT44((int)((ulong)uVar6 >> 0x20),0xfffffff7);
      sqlite3VdbeAddOp4((Vdbe *)CONCAT44(op,iVar2),(int)((ulong)pVVar4 >> 0x20),(int)pVVar4,
                        in_stack_ffffffffffffff84,p3,pcVar5,iVar9);
      uVar1 = 0;
      if (-1 < in_EDX) {
        uVar1 = 0x10;
      }
      sqlite3VdbeChangeP5(p,uVar1 | 1);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5,0);
      if (*(char *)(in_RSI + 0x62) == '\0') {
        sqlite3VdbeCurrentAddr(p);
      }
      else {
        in_stack_ffffffffffffff98 =
             sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),
                             (int)((ulong)pcVar5 >> 0x20));
        sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeAddOp4Int
                  ((Vdbe *)CONCAT44(op,iVar2),(int)((ulong)pVVar4 >> 0x20),(int)pVVar4,
                   in_stack_ffffffffffffff84,p3,(int)((ulong)pcVar5 >> 0x20));
        sqlite3UniqueConstraint(in_stack_ffffffffffffffc0,(int)((ulong)p >> 0x20),pIdx);
        sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),
                            (int)((ulong)pcVar5 >> 0x20));
      }
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iCur,in_stack_ffffffffffffff98),op,iVar2,
                        (int)((ulong)pVVar4 >> 0x20),(int)pVVar4);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5,0);
      sqlite3VdbeChangeP5(p,0x10);
      sqlite3ReleaseTempReg(in_RDI,prefixOnly);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5,0);
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),
                          (int)((ulong)pcVar5 >> 0x20));
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5);
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,p3),(int)((ulong)pcVar5 >> 0x20),
                        (int)pcVar5);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);
  sqlite3MultiWrite(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeGoto(v, 1);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeVerifyAbortable(v, OE_Abort);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
    sqlite3VdbeJumpHere(v, j2);
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  sqlite3VdbeAddOp1(v, OP_SeekEnd, iIdx);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}